

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O2

void pluslvl(boolean incr)

{
  schar sVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  xchar *pxVar7;
  xchar *pxVar8;
  xchar *pxVar9;
  xchar *pxVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  
  if (incr == '\0') {
    pline("You feel more experienced.");
  }
  iVar2 = newhp();
  uVar11._0_4_ = iVar2 + u.uhp;
  uVar11._4_4_ = iVar2 + u.uhpmax;
  u._1216_8_ = uVar11;
  if (u.umonnum != u.umonster) {
    uVar3 = mt_random();
    iVar2 = (uVar3 & 7) + 1;
    uVar12._0_4_ = iVar2 + u.mh;
    uVar12._4_4_ = iVar2 + u.mhmax;
    u._1016_8_ = uVar12;
  }
  iVar2 = (int)urole.xlev;
  pxVar10 = &urace.enadv.hifix;
  if (u.ulevel < iVar2) {
    pxVar10 = &urace.enadv.lofix;
  }
  pxVar8 = &urole.enadv.hifix;
  if (u.ulevel < iVar2) {
    pxVar8 = &urole.enadv.lofix;
  }
  pxVar7 = &urace.enadv.hirnd;
  if (u.ulevel < iVar2) {
    pxVar7 = &urace.enadv.lornd;
  }
  pxVar9 = &urole.enadv.hirnd;
  if (u.ulevel < iVar2) {
    pxVar9 = &urole.enadv.lornd;
  }
  sVar1 = acurr(2);
  iVar2 = rn2((int)*pxVar7 + (int)*pxVar9 + (int)(sVar1 / '\x02'));
  iVar4 = enermod((int)*pxVar10 + (int)*pxVar8 + iVar2);
  iVar2 = u.ulevel;
  uVar13._0_4_ = iVar4 + u.uen;
  uVar13._4_4_ = iVar4 + u.uenmax;
  u._1224_8_ = uVar13;
  if (u.ulevel < 0x1e) {
    if (incr == '\0') {
      lVar5 = newuexp(u.ulevel);
      u.uexp = (int)lVar5;
      uVar6 = (ulong)(iVar2 + 1);
    }
    else {
      uVar6 = (ulong)(u.ulevel + 1U);
      lVar5 = newuexp(u.ulevel + 1U);
      if (lVar5 <= u.uexp) {
        u.uexp = (int)lVar5 + -1;
      }
    }
    u.ulevel = (int)uVar6;
    if (u.ulevelmax <= iVar2) {
      u.ulevelmax = u.ulevel;
      historic_event('\0',"advanced to experience level %d.",uVar6);
    }
    pline("Welcome to experience level %d.",(ulong)(uint)u.ulevel);
    adjabil(u.ulevel + -1,u.ulevel);
    reset_rndmonst(-1);
  }
  iflags.botl = '\x01';
  return;
}

Assistant:

void pluslvl(boolean incr)
{
	int num;

	if (!incr) pline("You feel more experienced.");
	num = newhp();
	u.uhpmax += num;
	u.uhp += num;
	if (Upolyd) {
	    num = rnd(8);
	    u.mhmax += num;
	    u.mh += num;
	}
	if (u.ulevel < urole.xlev)
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.lornd + urace.enadv.lornd,
			urole.enadv.lofix + urace.enadv.lofix);
	else
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.hirnd + urace.enadv.hirnd,
			urole.enadv.hifix + urace.enadv.hifix);
	num = enermod(num);	/* M. Stephenson */
	u.uenmax += num;
	u.uen += num;
	if (u.ulevel < MAXULEV) {
	    if (incr) {
		long tmp = newuexp(u.ulevel + 1);
		if (u.uexp >= tmp) u.uexp = tmp - 1;
	    } else {
		u.uexp = newuexp(u.ulevel);
	    }
	    ++u.ulevel;
	    if (u.ulevelmax < u.ulevel) {
		u.ulevelmax = u.ulevel;
		historic_event(FALSE, "advanced to experience level %d.", u.ulevel);
	    }
	    pline("Welcome to experience level %d.", u.ulevel);
	    adjabil(u.ulevel - 1, u.ulevel);	/* give new intrinsics */
	    reset_rndmonst(NON_PM);		/* new monster selection */
	}
	iflags.botl = 1;
}